

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_negx(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize_00;
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  int opsize;
  TCGv_i32 addr;
  TCGv_i32 src;
  TCGv_i32 z;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  z = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  opsize_00 = insn_opsize((uint)insn);
  addr = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,
                *(TCGv_i32 *)(z + 0x94f8),(TCGv_i32 *)&stack0xffffffffffffffc0,EA_LOADS,
                (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (addr == *(TCGv_i32 *)(z + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    gen_flush_flags(pDStack_18);
    src = tcg_const_i32_m68k((TCGContext_conflict2 *)z,0);
    tcg_gen_add2_i32_m68k((TCGContext_conflict2 *)z,QREG_CC_N,QREG_CC_X,addr,src,QREG_CC_X,src);
    tcg_gen_sub2_i32_m68k((TCGContext_conflict2 *)z,QREG_CC_N,QREG_CC_X,src,src,QREG_CC_N,QREG_CC_X)
    ;
    tcg_temp_free_i32((TCGContext_conflict2 *)z,src);
    gen_ext((TCGContext_conflict2 *)z,QREG_CC_N,QREG_CC_N,opsize_00,1);
    tcg_gen_andi_i32_m68k((TCGContext_conflict2 *)z,QREG_CC_X,QREG_CC_X,1);
    tcg_gen_and_i32((TCGContext_conflict2 *)z,QREG_CC_V,QREG_CC_N,addr);
    tcg_gen_or_i32((TCGContext_conflict2 *)z,QREG_CC_Z,QREG_CC_Z,QREG_CC_N);
    tcg_gen_mov_i32((TCGContext_conflict2 *)z,QREG_CC_C,QREG_CC_X);
    set_cc_op(pDStack_18,CC_OP_FLAGS);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,QREG_CC_N,
                    (TCGv_i32 *)&stack0xffffffffffffffc0,EA_STORE,
                    (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(z + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
  }
  return;
}

Assistant:

DISAS_INSN(negx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv z;
    TCGv src;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src, opsize, 1, &addr);

    gen_flush_flags(s); /* compute old Z */

    /*
     * Perform substract with borrow.
     * (X, N) =  -(src + X);
     */

    z = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_add2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, src, z, QREG_CC_X, z);
    tcg_gen_sub2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, z, z, QREG_CC_N, QREG_CC_X);
    tcg_temp_free(tcg_ctx, z);
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);

    tcg_gen_andi_i32(tcg_ctx, QREG_CC_X, QREG_CC_X, 1);

    /*
     * Compute signed-overflow for negation.  The normal formula for
     * subtraction is (res ^ src) & (src ^ dest), but with dest==0
     * this simplies to res & src.
     */

    tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, src);

    /* Copy the rest of the results into place.  */
    tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N); /* !Z is sticky */
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);

    set_cc_op(s, CC_OP_FLAGS);

    /* result is in QREG_CC_N */

    DEST_EA(env, insn, opsize, QREG_CC_N, &addr);
}